

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

WriteDescriptorResult __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeDescriptor
          (PipelineClient *this,Builder descriptor,Vector<int> *fds)

{
  ArrayPtr<const_capnp::PipelineOp> ops;
  ClientHook *extraout_RDX;
  Orphanage orphanage;
  WriteDescriptorResult WVar1;
  Builder promisedAnswer;
  StructBuilder in_stack_ffffffffffffffa0;
  RemoveConst<int> *local_38;
  
  rpc::CapDescriptor::Builder::initReceiverAnswer((Builder *)&stack0xffffffffffffffb8,&descriptor);
  *local_38 = fds[2].builder.pos[8];
  orphanage = Orphanage::getForMessageContaining<capnp::rpc::CapDescriptor::Builder>
                        ((Builder)in_stack_ffffffffffffffa0);
  ops.ptr = (PipelineOp *)fds[2].builder.endPtr;
  ops.size_ = (size_t)fds[2].builder.disposer;
  anon_unknown_18::fromPipelineOps
            ((Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)
             &stack0xffffffffffffff98,orphanage,ops);
  rpc::PromisedAnswer::Builder::adoptTransform
            ((Builder *)&stack0xffffffffffffffb8,
             (Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)
             &stack0xffffffffffffff98);
  OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&stack0xffffffffffffff98);
  *(undefined1 *)&(this->super_RpcClient).super_ClientHook._vptr_ClientHook = 0;
  (this->super_RpcClient).super_ClientHook.brand = fds;
  WVar1.described = extraout_RDX;
  WVar1.exportId.ptr = (NullableValue<unsigned_int>)this;
  return WVar1;
}

Assistant:

WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      auto promisedAnswer = descriptor.initReceiverAnswer();
      promisedAnswer.setQuestionId(questionRef->getId());
      promisedAnswer.adoptTransform(fromPipelineOps(
          Orphanage::getForMessageContaining(descriptor), ops));
      return {
        .exportId = kj::none,
        .described = *this,
      };
    }